

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void socketpair_pinger_new(int vectored_writes)

{
  int iVar1;
  uv_handle_type uVar2;
  pinger_t *pinger;
  uv_loop_t *puVar3;
  uv_tcp_t *tcp;
  undefined8 uVar4;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_232_2_629321f6_for_stream *tcp_00;
  char *pcVar8;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_sock_t fds [2];
  
  pinger = (pinger_t *)malloc(0x168);
  if (pinger == (pinger_t *)0x0) {
    pcVar5 = "pinger";
    uVar4 = 0x136;
LAB_00159e0b:
    eval_b = 0;
    pcVar8 = "!=";
    eval_a = 0;
    pcVar7 = "NULL";
    pcVar6 = "!=";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
  }
  else {
    pinger->vectored_writes = vectored_writes;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PONG;
    uv_default_loop();
    iVar1 = uv_socketpair(1,0,fds,0x40,0x40);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uVar2 = uv_guess_handle(fds[0]);
      eval_a = (int64_t)uVar2;
      eval_b = 7;
      if (eval_a == 7) {
        uVar2 = uv_guess_handle(fds[1]);
        eval_a = (int64_t)uVar2;
        eval_b = 7;
        if (eval_a == 7) {
          puVar3 = uv_default_loop();
          tcp_00 = &pinger->stream;
          iVar1 = uv_tcp_init(puVar3,&tcp_00->tcp);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            (pinger->stream).tcp.data = pinger;
            iVar1 = uv_tcp_open(&tcp_00->tcp,fds[1]);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              tcp = (uv_tcp_t *)malloc(0xd8);
              if (tcp == (uv_tcp_t *)0x0) {
                pcVar5 = "ponger";
                uVar4 = 0x14a;
                goto LAB_00159e0b;
              }
              tcp->data = (void *)0x0;
              puVar3 = uv_default_loop();
              iVar1 = uv_tcp_init(puVar3,tcp);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                iVar1 = uv_tcp_open(tcp,fds[0]);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  pinger_write_ping(pinger);
                  iVar1 = uv_read_start((uv_stream_t *)&tcp_00->tcp,alloc_cb,pinger_read_cb);
                  eval_a = (int64_t)iVar1;
                  eval_b = 0;
                  if (eval_a == 0) {
                    iVar1 = uv_read_start((uv_stream_t *)tcp,alloc_cb,ponger_read_cb);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      return;
                    }
                    pcVar7 = "0";
                    pcVar5 = "uv_read_start((uv_stream_t*) ponger, alloc_cb, ponger_read_cb)";
                    uVar4 = 0x156;
                  }
                  else {
                    pcVar7 = "0";
                    pcVar5 = 
                    "uv_read_start((uv_stream_t*) &pinger->stream.tcp, alloc_cb, pinger_read_cb)";
                    uVar4 = 0x153;
                  }
                }
                else {
                  pcVar7 = "0";
                  pcVar5 = "uv_tcp_open(ponger, fds[0])";
                  uVar4 = 0x14d;
                }
              }
              else {
                pcVar7 = "0";
                pcVar5 = "uv_tcp_init(uv_default_loop(), ponger)";
                uVar4 = 0x14c;
              }
            }
            else {
              pcVar7 = "0";
              pcVar5 = "uv_tcp_open(&pinger->stream.tcp, fds[1])";
              uVar4 = 0x147;
            }
          }
          else {
            pcVar7 = "0";
            pcVar5 = "uv_tcp_init(uv_default_loop(), &pinger->stream.tcp)";
            uVar4 = 0x145;
          }
        }
        else {
          pcVar7 = "UV_NAMED_PIPE";
          pcVar5 = "uv_guess_handle((uv_os_fd_t) fds[1])";
          uVar4 = 0x142;
        }
      }
      else {
        pcVar7 = "UV_NAMED_PIPE";
        pcVar5 = "uv_guess_handle((uv_os_fd_t) fds[0])";
        uVar4 = 0x141;
      }
    }
    else {
      pcVar7 = "0";
      pcVar5 = "uv_socketpair(SOCK_STREAM, 0, fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE)";
      uVar4 = 0x13e;
    }
    pcVar6 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar8 = "==";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar4,pcVar5,pcVar6,pcVar7,eval_a,pcVar8,eval_b);
  abort();
}

Assistant:

static void socketpair_pinger_new(int vectored_writes) {
  pinger_t* pinger;
  uv_os_sock_t fds[2];
  uv_tcp_t* ponger;

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PONG;

  /* Try to make a socketpair and do NUM_PINGS ping-pongs. */
  (void)uv_default_loop(); /* ensure WSAStartup has been performed */
  ASSERT_OK(uv_socketpair(SOCK_STREAM, 0, fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
#ifndef _WIN32
  /* On Windows, this is actually a UV_TCP, but libuv doesn't detect that. */
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[1]), UV_NAMED_PIPE);
#endif

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &pinger->stream.tcp));
  pinger->stream.pipe.data = pinger;
  ASSERT_OK(uv_tcp_open(&pinger->stream.tcp, fds[1]));

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ponger->data = NULL;
  ASSERT_OK(uv_tcp_init(uv_default_loop(), ponger));
  ASSERT_OK(uv_tcp_open(ponger, fds[0]));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) &pinger->stream.tcp,
                          alloc_cb,
                          pinger_read_cb));
  ASSERT_OK(uv_read_start((uv_stream_t*) ponger,
                          alloc_cb,
                          ponger_read_cb));
}